

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRec3.c
# Opt level: O0

Vec_Int_t * Lms_GiaCountTruths(Lms_Man_t *p)

{
  int iVar1;
  Vec_Int_t *p_00;
  int local_1c;
  int Entry;
  int i;
  Vec_Int_t *vCounts;
  Lms_Man_t *p_local;
  
  iVar1 = Vec_MemEntryNum(p->vTtMem);
  p_00 = Vec_IntStart(iVar1);
  for (local_1c = 0; iVar1 = Vec_IntSize(p->vTruthIds), local_1c < iVar1; local_1c = local_1c + 1) {
    iVar1 = Vec_IntEntry(p->vTruthIds,local_1c);
    if (-1 < iVar1) {
      Vec_IntAddToEntry(p_00,iVar1,1);
    }
  }
  return p_00;
}

Assistant:

Vec_Int_t * Lms_GiaCountTruths( Lms_Man_t * p )
{
    Vec_Int_t * vCounts = Vec_IntStart( Vec_MemEntryNum(p->vTtMem) );
    int i, Entry;
    Vec_IntForEachEntry( p->vTruthIds, Entry, i )
        if ( Entry >= 0 )
            Vec_IntAddToEntry( vCounts, Entry, 1 );
    return vCounts;
}